

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

void Curl_cpool_destroy(cpool *cpool)

{
  Curl_easy **datap;
  Curl_easy *pCVar1;
  CURLcode CVar2;
  connectdata *pcVar3;
  Curl_llist_node *pCVar4;
  timediff_t tVar5;
  int iVar6;
  curltime cVar7;
  curltime cVar8;
  curltime newer;
  curl_pollfds local_140;
  sigpipe_ignore local_128;
  pollfd a_few_on_stack [10];
  
  if (cpool != (cpool *)0x0) {
    pCVar1 = cpool->idata;
    if (pCVar1 != (Curl_easy *)0x0) {
      memset(&local_128,0,0xa0);
      local_128.no_signal = true;
      if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
        Curl_share_lock(pCVar1,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
      }
      datap = &cpool->idata;
      cpool->field_0x98 = cpool->field_0x98 | 1;
      pcVar3 = cpool_get_live_conn(cpool);
      while (pcVar3 != (connectdata *)0x0) {
        cpool_remove_conn(cpool,pcVar3);
        sigpipe_apply(cpool->idata,&local_128);
        Curl_conncontrol(pcVar3,1);
        cpool_discard_conn(cpool,cpool->idata,pcVar3,false);
        pcVar3 = cpool_get_live_conn(cpool);
      }
      cpool->field_0x98 = cpool->field_0x98 & 0xfe;
      if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
        Curl_share_unlock(*datap,CURL_LOCK_DATA_CONNECT);
      }
      sigpipe_apply(*datap,&local_128);
      pCVar1 = *datap;
      cVar7 = Curl_now();
      if (pCVar1 != (Curl_easy *)0x0) {
        while (pcVar3 = cpool_get_live_conn(cpool), pcVar3 != (connectdata *)0x0) {
          cpool_remove_conn(cpool,pcVar3);
          cpool_discard_conn(cpool,pCVar1,pcVar3,false);
        }
        while (pCVar4 = Curl_llist_head(&cpool->shutdowns), pCVar4 != (Curl_llist_node *)0x0) {
          cpool_perform(cpool);
          pCVar4 = Curl_llist_head(&cpool->shutdowns);
          if (pCVar4 == (Curl_llist_node *)0x0) break;
          cVar8 = Curl_now();
          newer._12_4_ = 0;
          newer.tv_sec = SUB128(cVar8._0_12_,0);
          newer.tv_usec = SUB124(cVar8._0_12_,8);
          cVar8._12_4_ = 0;
          cVar8.tv_sec = SUB128(cVar7._0_12_,0);
          cVar8.tv_usec = SUB124(cVar7._0_12_,8);
          tVar5 = Curl_timediff(newer,cVar8);
          if (-1 < tVar5) break;
          Curl_pollfds_init(&local_140,a_few_on_stack,10);
          CVar2 = cpool_add_pollfds(cpool,&local_140);
          if (CVar2 != CURLE_OK) {
            Curl_pollfds_cleanup(&local_140);
            break;
          }
          iVar6 = -(int)tVar5;
          if (999 < iVar6) {
            iVar6 = 1000;
          }
          Curl_poll(local_140.pfds,local_140.n,(long)iVar6);
          Curl_pollfds_cleanup(&local_140);
        }
        cpool_shutdown_discard_all(cpool);
      }
      cpool_shutdown_discard_all(cpool);
      Curl_hostcache_clean(cpool->idata,(cpool->idata->dns).hostcache);
      sigpipe_restore(&local_128);
      pCVar1 = cpool->idata;
      pCVar1->multi = (Curl_multi *)0x0;
      pCVar1->share = (Curl_share *)0x0;
      Curl_close(datap);
    }
    Curl_hash_destroy(&cpool->dest2bundle);
    cpool->multi = (Curl_multi *)0x0;
  }
  return;
}

Assistant:

void Curl_cpool_destroy(struct cpool *cpool)
{
  if(cpool) {
    if(cpool->idata) {
      cpool_close_and_destroy_all(cpool);
      /* The internal closure handle is special and we need to
       * disconnect it from multi/share before closing it down. */
      cpool->idata->multi = NULL;
      cpool->idata->share = NULL;
      Curl_close(&cpool->idata);
    }
    Curl_hash_destroy(&cpool->dest2bundle);
    cpool->multi = NULL;
  }
}